

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O3

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t _elemsize;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  LRN *pLVar5;
  pointer piVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  ulong local_180;
  allocator_type local_169;
  ulong local_168;
  ulong local_160;
  Mat local_158;
  ulong local_110;
  long local_108;
  void *local_100;
  ulong local_f8;
  LRN *local_f0;
  Mat local_e8;
  long local_98;
  void *local_90;
  long local_88;
  void *local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar7 = bottom_top_blob->w;
  local_168 = (ulong)(uint)bottom_top_blob->h;
  local_160 = (ulong)(uint)bottom_top_blob->c;
  _elemsize = bottom_top_blob->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,uVar7,bottom_top_blob->h,bottom_top_blob->c,_elemsize,
              opt->workspace_allocator);
  uVar22 = local_160;
  iVar15 = -100;
  if ((local_e8.data == (void *)0x0) || (local_e8.cstep * (long)local_e8.c == 0)) goto LAB_00301c4b;
  uVar14 = (int)local_168 * uVar7;
  iVar8 = (int)local_160;
  if (0 < iVar8) {
    pvVar16 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    uVar19 = 0;
    pvVar10 = local_e8.data;
    do {
      if (0 < (int)uVar14) {
        uVar20 = 0;
        do {
          fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
          *(float *)((long)pvVar10 + uVar20 * 4) = fVar1 * fVar1;
          uVar20 = uVar20 + 1;
        } while (uVar14 != uVar20);
      }
      uVar19 = uVar19 + 1;
      pvVar10 = (void *)((long)pvVar10 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
      pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar3);
    } while (uVar19 != local_160);
  }
  iVar15 = 0;
  local_f0 = this;
  if (this->region_type == 0) {
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    Mat::create(&local_158,uVar7,(int)local_168,iVar8,_elemsize,opt->workspace_allocator);
    if ((local_158.data == (void *)0x0) || (local_158.cstep * (long)local_158.c == 0)) {
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
joined_r0x00301c26:
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_00301c46:
      iVar15 = -100;
      goto LAB_00301c4b;
    }
    uVar7 = (int)local_158.cstep * local_158.c;
    if (0 < (int)uVar7) {
      memset(local_158.data,0,(ulong)uVar7 << 2);
    }
    if (0 < iVar8) {
      fVar1 = local_f0->alpha;
      iVar15 = local_f0->local_size;
      uVar7 = iVar15 / 2;
      local_f8 = (ulong)-uVar7;
      pvVar16 = bottom_top_blob->data;
      local_108 = (long)(int)uVar7;
      local_168 = local_158.cstep *
                  CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      local_100 = (void *)(bottom_top_blob->cstep * bottom_top_blob->elemsize);
      uVar19 = 0;
      pvVar10 = local_158.data;
      do {
        pLVar5 = local_f0;
        uVar11 = (int)local_f8 + (int)uVar19;
        if ((long)(int)uVar11 <= (long)(local_108 + uVar19)) {
          do {
            if ((uVar11 < (uint)uVar22) && (0 < (int)uVar14)) {
              uVar20 = 0;
              do {
                *(float *)((long)pvVar10 + uVar20 * 4) =
                     *(float *)((long)pvVar10 + uVar20 * 4) +
                     *(float *)((long)local_e8.data +
                               uVar20 * 4 +
                               (ulong)uVar11 *
                               local_e8.cstep *
                               CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
                uVar20 = uVar20 + 1;
              } while (uVar14 != uVar20);
            }
            bVar23 = uVar11 != uVar7;
            uVar11 = uVar11 + 1;
          } while (bVar23);
        }
        if (0 < (int)uVar14) {
          uVar22 = 0;
          do {
            fVar24 = powf(*(float *)((long)pvVar10 + uVar22 * 4) * fVar1 * (1.0 / (float)iVar15) +
                          pLVar5->bias,-pLVar5->beta);
            *(float *)((long)pvVar16 + uVar22 * 4) = fVar24 * *(float *)((long)pvVar16 + uVar22 * 4)
            ;
            uVar22 = uVar22 + 1;
          } while (uVar14 != uVar22);
        }
        uVar7 = uVar7 + 1;
        uVar19 = uVar19 + 1;
        pvVar10 = (void *)((long)pvVar10 + local_168);
        pvVar16 = (void *)((long)pvVar16 + (long)local_100);
        uVar22 = local_160;
      } while (uVar19 != local_160);
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar15 = 0;
    if (piVar4 == (int *)0x0) goto LAB_00301c4b;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_00301c4b;
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      goto LAB_00301c4b;
    }
  }
  else {
    if (this->region_type != 1) goto LAB_00301c4b;
    piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    local_158.data = local_e8.data;
    local_158.refcount._0_4_ = local_e8.refcount._0_4_;
    local_158.refcount._4_4_ = local_e8.refcount._4_4_;
    local_158.elemsize._0_4_ = (undefined4)local_e8.elemsize;
    local_158.elemsize._4_4_ = local_e8.elemsize._4_4_;
    local_158.elempack = local_e8.elempack;
    local_158.allocator = local_e8.allocator;
    local_158.dims = local_e8.dims;
    local_158.w = local_e8.w;
    local_158.h = local_e8.h;
    local_158.d = local_e8.d;
    local_158.c = local_e8.c;
    local_158.cstep = local_e8.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    uVar14 = this->local_size;
    uVar11 = uVar7;
    if (1 < (int)uVar14) {
      uVar11 = uVar14 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_e8,&local_158,uVar11,~uVar11 + uVar14,uVar11,~uVar11 + uVar14,0,0.0,
                       (Option *)&_space_ofs);
      if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0)) {
        piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_158.allocator == (Allocator *)0x0) goto joined_r0x00301c26;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_00301c46;
      }
      uVar14 = this->local_size;
      uVar11 = local_158.w;
    }
    uVar13 = uVar14 * uVar14;
    fVar1 = this->alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar13,&local_169);
    piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar15 = this->local_size;
    if (0 < iVar15) {
      iVar21 = uVar11 - iVar15;
      iVar8 = 0;
      iVar9 = 0;
      iVar12 = 0;
      do {
        if (0 < iVar15) {
          lVar18 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar12 + lVar18] = iVar9 + (int)lVar18;
            iVar15 = this->local_size;
            lVar18 = lVar18 + 1;
            iVar17 = (int)lVar18;
          } while (iVar17 < iVar15);
          iVar12 = iVar12 + iVar17;
          iVar9 = iVar9 + iVar17;
        }
        iVar9 = iVar9 + iVar21;
        iVar8 = iVar8 + 1;
      } while (iVar8 < iVar15);
    }
    if (0 < (int)local_160) {
      local_f8 = (ulong)(int)uVar7;
      local_80 = bottom_top_blob->data;
      local_88 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_90 = local_158.data;
      local_98 = local_158.cstep * CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize)
      ;
      local_108 = (long)local_158.w *
                  CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      local_110 = 0;
      do {
        if (0 < (int)local_168) {
          local_100 = (void *)(local_98 * local_110 + (long)local_90);
          pvVar16 = (void *)(local_88 * local_110 + (long)local_80);
          local_180 = 0;
          do {
            pvVar10 = local_100;
            if (0 < (int)uVar7) {
              lVar18 = local_108 * local_180;
              uVar22 = 0;
              do {
                if (uVar14 == 0) {
                  fVar24 = 0.0;
                }
                else {
                  fVar24 = 0.0;
                  uVar19 = 0;
                  do {
                    fVar24 = fVar24 + *(float *)((long)pvVar10 +
                                                (long)piVar6[uVar19] * 4 + uVar22 * 4 + lVar18);
                    uVar19 = uVar19 + 1;
                  } while (uVar13 + (uVar13 == 0) != uVar19);
                }
                fVar24 = powf(fVar24 * fVar1 * (1.0 / (float)(int)uVar13) + local_f0->bias,
                              -local_f0->beta);
                *(float *)((long)pvVar16 + uVar22 * 4) =
                     fVar24 * *(float *)((long)pvVar16 + uVar22 * 4);
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar7);
            }
            pvVar16 = (void *)((long)pvVar16 + local_f8 * 4);
            local_180 = local_180 + 1;
          } while (local_180 != local_168);
        }
        local_110 = local_110 + 1;
      } while (local_110 != local_160);
    }
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar6);
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar15 = 0;
    if (piVar4 == (int *)0x0) goto LAB_00301c4b;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_00301c4b;
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      goto LAB_00301c4b;
    }
  }
  iVar15 = 0;
  if (local_158.data != (void *)0x0) {
    iVar15 = 0;
    free(local_158.data);
  }
LAB_00301c4b:
  piVar4 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i = 0; i < size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * powf(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            opt_b.use_packing_layout = false;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}